

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_skl_motion.cxx
# Opt level: O0

void __thiscall xray_re::xr_bone_motion::create_envelopes(xr_bone_motion *this)

{
  xr_envelope *this_00;
  long local_18;
  uint_fast32_t i;
  xr_bone_motion *this_local;
  
  local_18 = 6;
  while (local_18 != 0) {
    this_00 = (xr_envelope *)operator_new(0x28);
    xr_envelope::xr_envelope(this_00);
    this->m_envelopes[local_18 + -1] = this_00;
    local_18 = local_18 + -1;
  }
  return;
}

Assistant:

void xr_bone_motion::create_envelopes()
{
	for (uint_fast32_t i = 6; i != 0;)
		m_envelopes[--i] = new xr_envelope;
}